

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O0

void __thiscall
COLLADASaxFWL::KinematicsController::KinematicsController
          (KinematicsController *this,URI *uri,String *name)

{
  string *in_RDX;
  undefined8 *in_RDI;
  bool in_stack_00000057;
  URI *in_stack_00000058;
  URI *in_stack_00000060;
  IntermediateTargetableTemplate<5UL> *in_stack_ffffffffffffffd0;
  
  IntermediateTargetableTemplate<5UL>::IntermediateTargetableTemplate(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__KinematicsController_00e5b2a8;
  COLLADABU::URI::URI(in_stack_00000060,in_stack_00000058,in_stack_00000057);
  std::__cxx11::string::string((string *)(in_RDI + 0x1e),in_RDX);
  std::vector<COLLADASaxFWL::AxisInfo,_std::allocator<COLLADASaxFWL::AxisInfo>_>::vector
            ((vector<COLLADASaxFWL::AxisInfo,_std::allocator<COLLADASaxFWL::AxisInfo>_> *)0xc2fcbd);
  std::__cxx11::
  list<COLLADASaxFWL::KinematicsInstanceKinematicsModel,_std::allocator<COLLADASaxFWL::KinematicsInstanceKinematicsModel>_>
  ::list((list<COLLADASaxFWL::KinematicsInstanceKinematicsModel,_std::allocator<COLLADASaxFWL::KinematicsInstanceKinematicsModel>_>
          *)0xc2fccd);
  return;
}

Assistant:

KinematicsController(const COLLADABU::URI& uri, const String& name )
			: mUri( uri ), mName(name) {}